

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_printf_describe(roaring_bitmap_t *r)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  char *pcVar4;
  int *in_RDI;
  int i;
  roaring_array_t *ra;
  undefined4 in_stack_ffffffffffffffd8;
  int local_14;
  
  printf("{");
  for (local_14 = 0; local_14 < *in_RDI; local_14 = local_14 + 1) {
    uVar1 = (uint)*(ushort *)(*(long *)(in_RDI + 4) + (long)local_14 * 2);
    pcVar4 = get_full_container_name
                       (*(container_t **)(*(long *)(in_RDI + 2) + (long)local_14 * 8),
                        *(uint8_t *)(*(long *)(in_RDI + 6) + (long)local_14));
    uVar2 = container_get_cardinality((container_t *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),'\0')
    ;
    printf("%d: %s (%d)",(ulong)uVar1,pcVar4,(ulong)uVar2);
    if (*(char *)(*(long *)(in_RDI + 6) + (long)local_14) == '\x04') {
      uVar3 = croaring_refcount_get
                        ((croaring_refcount_t *)
                         (*(long *)(*(long *)(in_RDI + 2) + (long)local_14 * 8) + 0xc));
      printf("(shared count = %u )",(ulong)uVar3);
    }
    if (local_14 + 1 < *in_RDI) {
      printf(", ");
    }
  }
  printf("}");
  return;
}

Assistant:

void roaring_bitmap_printf_describe(const roaring_bitmap_t *r) {
    const roaring_array_t *ra = &r->high_low_container;

    printf("{");
    for (int i = 0; i < ra->size; ++i) {
        printf("%d: %s (%d)", ra->keys[i],
               get_full_container_name(ra->containers[i], ra->typecodes[i]),
               container_get_cardinality(ra->containers[i], ra->typecodes[i]));
        if (ra->typecodes[i] == SHARED_CONTAINER_TYPE) {
            printf("(shared count = %" PRIu32 " )",
                   croaring_refcount_get(
                       &(CAST_shared(ra->containers[i])->counter)));
        }

        if (i + 1 < ra->size) {
            printf(", ");
        }
    }
    printf("}");
}